

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalsocket_unix.cpp
# Opt level: O3

void __thiscall
QLocalSocketPrivate::_q_errorOccurred(QLocalSocketPrivate *this,SocketError socketError)

{
  QLocalSocket *this_00;
  QLocalSocketPrivate *this_01;
  long in_FS_OFFSET;
  QByteArrayView QVar1;
  QString local_58;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLocalSocket **)&this->field_0x8;
  QVar1.m_data = (storage_type *)0xc;
  QVar1.m_size = (qsizetype)&local_38;
  this_01 = (QLocalSocketPrivate *)0xc;
  QString::fromLatin1(QVar1);
  local_58.d.d = local_38.d.d;
  local_58.d.ptr = local_38.d.ptr;
  local_58.d.size = local_38.d.size;
  local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  generateErrorString(&local_38,this_01,socketError,&local_58);
  QIODevice::setErrorString((QString *)this_00);
  QLocalSocket::errorOccurred(this_00,socketError);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLocalSocketPrivate::_q_errorOccurred(QAbstractSocket::SocketError socketError)
{
    Q_Q(QLocalSocket);
    QString function = "QLocalSocket"_L1;
    QLocalSocket::LocalSocketError error = (QLocalSocket::LocalSocketError)socketError;
    QString errorString = generateErrorString(error, function);
    q->setErrorString(errorString);
    emit q->errorOccurred(error);
}